

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void gola_close(LexState *ls,VarInfo *vg)

{
  uint pc_00;
  FuncState *fs_00;
  BCPos BVar1;
  BCInsLine *pBVar2;
  long in_RSI;
  undefined8 *in_RDI;
  BCPos next;
  BCIns *ip;
  BCPos pc;
  FuncState *fs;
  BCPos in_stack_ffffffffffffffc8;
  BCPos in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  fs_00 = (FuncState *)*in_RDI;
  pc_00 = *(uint *)(in_RSI + 4);
  pBVar2 = fs_00->bcbase + pc_00;
  *(undefined1 *)((long)&pBVar2->ins + 1) = *(undefined1 *)(in_RSI + 0xc);
  if ((pBVar2->ins & 0xff) == 0x58) {
    BVar1 = jmp_next(fs_00,pc_00);
    if (BVar1 != 0xffffffff) {
      jmp_patch((FuncState *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                in_stack_ffffffffffffffc8);
    }
    *(undefined1 *)&pBVar2->ins = 0x32;
    *(undefined2 *)((long)&pBVar2->ins + 2) = 0x7fff;
  }
  return;
}

Assistant:

static void gola_close(LexState *ls, VarInfo *vg)
{
  FuncState *fs = ls->fs;
  BCPos pc = vg->startpc;
  BCIns *ip = &fs->bcbase[pc].ins;
  lj_assertFS(gola_isgoto(vg), "expected goto");
  lj_assertFS(bc_op(*ip) == BC_JMP || bc_op(*ip) == BC_UCLO,
	      "bad bytecode op %d", bc_op(*ip));
  setbc_a(ip, vg->slot);
  if (bc_op(*ip) == BC_JMP) {
    BCPos next = jmp_next(fs, pc);
    if (next != NO_JMP) jmp_patch(fs, next, pc);  /* Jump to UCLO. */
    setbc_op(ip, BC_UCLO);  /* Turn into UCLO. */
    setbc_j(ip, NO_JMP);
  }
}